

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

TestSuite * __thiscall
testing::internal::UnitTestImpl::GetTestSuite
          (UnitTestImpl *this,char *test_suite_name,char *type_param,SetUpTestSuiteFunc set_up_tc,
          TearDownTestSuiteFunc tear_down_tc)

{
  pointer *pppTVar1;
  int iVar2;
  iterator __position;
  iterator __position_00;
  bool bVar3;
  TestSuite *this_00;
  TestSuite *new_test_suite;
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
  test_suite;
  allocator local_99;
  TestSuite *local_98;
  __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
  local_90;
  string local_88;
  vector<testing::TestSuite*,std::allocator<testing::TestSuite*>> *local_68;
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 local_40 [16];
  
  local_60._8_8_ =
       (this->test_suites_).
       super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_60._0_8_ =
       (this->test_suites_).
       super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&local_88,test_suite_name,(allocator *)&local_98);
  local_50._M_allocated_capacity = (size_type)local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_60 + 0x10),
             CONCAT44(local_88._M_dataplus._M_p._4_4_,(int)local_88._M_dataplus._M_p),
             local_88._M_string_length +
             CONCAT44(local_88._M_dataplus._M_p._4_4_,(int)local_88._M_dataplus._M_p));
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite**,std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>>>,testing::internal::TestSuiteNameIs>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
              *)&local_90,
             (reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
              *)(local_60 + 8),(TestSuiteNameIs *)local_60);
  if ((undefined1 *)local_50._M_allocated_capacity != local_40) {
    operator_delete((void *)local_50._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_88._M_dataplus._M_p._4_4_,(int)local_88._M_dataplus._M_p) !=
      &local_88.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_88._M_dataplus._M_p._4_4_,(int)local_88._M_dataplus._M_p));
  }
  if (local_90._M_current ==
      (this->test_suites_).
      super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_68 = (vector<testing::TestSuite*,std::allocator<testing::TestSuite*>> *)
               &this->test_suites_;
    this_00 = (TestSuite *)operator_new(0x108);
    TestSuite::TestSuite(this_00,test_suite_name,type_param,set_up_tc,tear_down_tc);
    local_98 = this_00;
    std::__cxx11::string::string((string *)&local_88,test_suite_name,&local_99);
    bVar3 = UnitTestOptions::MatchesFilter(&local_88,"*DeathTest:*DeathTest/*");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_88._M_dataplus._M_p._4_4_,(int)local_88._M_dataplus._M_p) !=
        &local_88.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_88._M_dataplus._M_p._4_4_,(int)local_88._M_dataplus._M_p));
    }
    if (bVar3) {
      iVar2 = this->last_death_test_suite_;
      this->last_death_test_suite_ = iVar2 + 1;
      std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::insert
                ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)local_68,
                 (const_iterator)
                 ((this->test_suites_).
                  super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                  _M_impl.super__Vector_impl_data._M_start + (long)iVar2 + 1),&local_98);
    }
    else {
      __position._M_current =
           (this->test_suites_).
           super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->test_suites_).
          super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>::
        _M_realloc_insert<testing::TestSuite*const&>(local_68,__position,&local_98);
      }
      else {
        *__position._M_current = local_98;
        pppTVar1 = &(this->test_suites_).
                    super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
    }
    __position_00._M_current =
         (this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_88._M_dataplus._M_p._0_4_ =
         (int)((ulong)((long)__position_00._M_current -
                      (long)(this->test_suite_indices_).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
    if (__position_00._M_current ==
        (this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->test_suite_indices_,__position_00,(int *)&local_88);
    }
    else {
      *__position_00._M_current = (int)local_88._M_dataplus._M_p;
      (this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position_00._M_current + 1;
    }
  }
  else {
    local_98 = local_90._M_current[-1];
  }
  return local_98;
}

Assistant:

TestSuite* UnitTestImpl::GetTestSuite(
    const char* test_suite_name, const char* type_param,
    internal::SetUpTestSuiteFunc set_up_tc,
    internal::TearDownTestSuiteFunc tear_down_tc) {
  // Can we find a TestSuite with the given name?
  const auto test_suite =
      std::find_if(test_suites_.rbegin(), test_suites_.rend(),
                   TestSuiteNameIs(test_suite_name));

  if (test_suite != test_suites_.rend()) return *test_suite;

  // No.  Let's create one.
  auto* const new_test_suite =
      new TestSuite(test_suite_name, type_param, set_up_tc, tear_down_tc);

  // Is this a death test suite?
  if (internal::UnitTestOptions::MatchesFilter(test_suite_name,
                                               kDeathTestSuiteFilter)) {
    // Yes.  Inserts the test suite after the last death test suite
    // defined so far.  This only works when the test suites haven't
    // been shuffled.  Otherwise we may end up running a death test
    // after a non-death test.
    ++last_death_test_suite_;
    test_suites_.insert(test_suites_.begin() + last_death_test_suite_,
                        new_test_suite);
  } else {
    // No.  Appends to the end of the list.
    test_suites_.push_back(new_test_suite);
  }

  test_suite_indices_.push_back(static_cast<int>(test_suite_indices_.size()));
  return new_test_suite;
}